

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errorHandle.hpp
# Opt level: O0

void __thiscall blc::error::exception::~exception(exception *this)

{
  exception *in_RDI;
  
  ~exception(in_RDI);
  operator_delete(in_RDI,0x78);
  return;
}

Assistant:

~exception() {}